

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O0

void QTable::Load(string *filename,size_t nrRows,size_t nrColumns,size_t nrTables,QTables *Qs)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  reference pdVar5;
  undefined8 uVar6;
  size_type in_RCX;
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  vector<QTable,_std::allocator<QTable>_> *in_R8;
  istringstream is;
  string buffer;
  QTable Q;
  double q;
  size_t i;
  size_t s;
  size_t a;
  ifstream fp;
  size_type in_stack_fffffffffffffb68;
  QTable *in_stack_fffffffffffffb70;
  value_type *in_stack_fffffffffffffb78;
  vector<QTable,_std::allocator<QTable>_> *in_stack_fffffffffffffb80;
  double dVar7;
  size_t in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  long *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  istringstream local_430 [384];
  string local_2b0 [80];
  double local_260;
  size_type local_258;
  long local_250;
  long local_248;
  long local_230 [65];
  vector<QTable,_std::allocator<QTable>_> *local_28;
  size_type local_20;
  long local_18;
  long local_10;
  string *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_230,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"QTable::Load: failed to ");
    poVar4 = std::operator<<(poVar4,"open file ");
    poVar4 = std::operator<<(poVar4,local_8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  QTable((QTable *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
         in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
  std::vector<QTable,_std::allocator<QTable>_>::clear
            ((vector<QTable,_std::allocator<QTable>_> *)0x9ffcef);
  for (local_258 = 0; local_258 != local_20; local_258 = local_258 + 1) {
    std::vector<QTable,_std::allocator<QTable>_>::push_back
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  }
  local_250 = 0;
  local_258 = 0;
  std::__cxx11::string::string(local_2b0);
  while( true ) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_230,local_2b0);
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      if (local_258 == local_20) {
        std::__cxx11::string::~string(local_2b0);
        ~QTable(in_stack_fffffffffffffb70);
        std::ifstream::~ifstream(local_230);
        return;
      }
      uVar6 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT17(bVar1,in_stack_fffffffffffffba0),(char *)in_stack_fffffffffffffb98);
      __cxa_throw(uVar6,&E::typeinfo,E::~E);
    }
    std::__cxx11::istringstream::istringstream(local_430,local_2b0,_S_in);
    local_248 = 0;
    while( true ) {
      in_stack_fffffffffffffb98 = (long *)std::istream::operator>>(local_430,&local_260);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)in_stack_fffffffffffffb98 +
                                *(long *)(*in_stack_fffffffffffffb98 + -0x18)));
      if (!bVar2) break;
      dVar7 = local_260;
      std::vector<QTable,_std::allocator<QTable>_>::operator[](local_28,local_258);
      local_248 = local_248 + 1;
      pdVar5 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,0x9ffe72);
      *pdVar5 = dVar7;
    }
    if (local_248 != local_18) break;
    local_250 = local_250 + 1;
    if (local_250 == local_10) {
      local_258 = local_258 + 1;
      local_250 = 0;
    }
    std::__cxx11::istringstream::~istringstream(local_430);
  }
  uVar6 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT17(bVar1,in_stack_fffffffffffffba0),(char *)in_stack_fffffffffffffb98);
  __cxa_throw(uVar6,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Load(const std::string &filename,
                  size_t nrRows,
                  size_t nrColumns,
                  size_t nrTables,
                  QTables &Qs)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "QTable::Load: failed to "
             << "open file " << filename << endl;            
    }

    size_t a,s,i;
    double q;

    QTable Q(nrRows,nrColumns);
//    QTables Qs;
    Qs.clear();
    for(i=0;i!=nrTables;i++)
        Qs.push_back(Q);
    
    s=0;
    i=0;
    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        a=0;
        while(is >> q)
            Qs[i](s,a++)=q;

        if(a!=nrColumns)
            throw(E("QTable::Load wrong number of columns"));

        s++;
        if(s==nrRows)
        {
            i++;
            s=0;
        }
    }
    
    if(i!=nrTables)
        throw(E("QTable::Load wrong number of tables"));
}